

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O2

void inproc_queue_cancel(nni_aio *aio,void *arg,int rv)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x30));
  iVar1 = nni_aio_list_active(aio);
  if (iVar1 != 0) {
    nni_aio_list_remove(aio);
    nni_aio_finish_error(aio,rv);
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x30));
  return;
}

Assistant:

static void
inproc_queue_cancel(nni_aio *aio, void *arg, int rv)
{
	inproc_queue *queue = arg;

	nni_mtx_lock(&queue->lock);
	if (nni_aio_list_active(aio)) {
		nni_aio_list_remove(aio);
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&queue->lock);
}